

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

double __thiscall mp::PLTerm::slope(PLTerm *this,int index)

{
  Impl *pIVar1;
  int in_ESI;
  
  pIVar1 = impl((PLTerm *)0x2b7f57);
  return pIVar1->data[in_ESI << 1];
}

Assistant:

double slope(int index) const {
    MP_ASSERT(index >= 0 && index < num_slopes(), "index out of bounds");
    return impl()->data[2 * index];
  }